

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match_basic_types.h
# Opt level: O3

Lit_t __thiscall Potassco::ProgramReader::matchLit(ProgramReader *this,char *err)

{
  bool bVar1;
  uint line;
  BufferedStream *this_00;
  ulong uVar2;
  int64_t x;
  long local_20;
  
  this_00 = stream(this);
  uVar2 = (ulong)this->varMax_;
  bVar1 = BufferedStream::match(this_00,&local_20,false);
  if ((((!bVar1) || (local_20 == 0)) || (SBORROW8(local_20,-uVar2) != (long)(local_20 + uVar2) < 0))
     || ((long)uVar2 < local_20)) {
    line = BufferedStream::line(this_00);
    BufferedStream::fail(line,err);
  }
  return (Lit_t)local_20;
}

Assistant:

Lit_t    matchLit(const char* err = "literal expected") { return Potassco::matchLit(*stream(), varMax_, err); }